

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O2

int apply_to_counts(hdr_histogram *h,int32_t word_size,uint8_t *counts_data,int32_t counts_limit)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint *puVar4;
  uint *puVar5;
  
  puVar4 = &switchD_0010581c::switchdataD_00106e3c;
  switch(word_size) {
  case 1:
    iVar3 = apply_to_counts_zz(h,counts_data,counts_limit);
    return iVar3;
  case 2:
    puVar4 = (uint *)0x0;
    puVar5 = (uint *)(ulong)(uint)counts_limit;
    if (counts_limit < 1) {
      puVar5 = puVar4;
    }
    for (; puVar5 != puVar4; puVar4 = (uint *)((long)puVar4 + 1)) {
      h->counts[(long)puVar4] =
           (ulong)(ushort)(*(ushort *)(counts_data + (long)puVar4 * 2) << 8 |
                          *(ushort *)(counts_data + (long)puVar4 * 2) >> 8);
    }
    break;
  case 4:
    puVar4 = (uint *)0x0;
    puVar5 = (uint *)(ulong)(uint)counts_limit;
    if (counts_limit < 1) {
      puVar5 = puVar4;
    }
    for (; puVar5 != puVar4; puVar4 = (uint *)((long)puVar4 + 1)) {
      uVar1 = *(uint *)(counts_data + (long)puVar4 * 4);
      h->counts[(long)puVar4] =
           (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
    }
    break;
  case 8:
    puVar4 = (uint *)0x0;
    puVar5 = (uint *)(ulong)(uint)counts_limit;
    if (counts_limit < 1) {
      puVar5 = puVar4;
    }
    for (; puVar5 != puVar4; puVar4 = (uint *)((long)puVar4 + 1)) {
      uVar2 = *(ulong *)(counts_data + (long)puVar4 * 8);
      h->counts[(long)puVar4] =
           uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    }
  }
  return (int)puVar4;
}

Assistant:

static int apply_to_counts(
    struct hdr_histogram* h, const int32_t word_size, const uint8_t* counts_data, const int32_t counts_limit)
{
    switch (word_size)
    {
        case 2:
            apply_to_counts_16(h, (const int16_t*) counts_data, counts_limit);
            return 0;

        case 4:
            apply_to_counts_32(h, (const int32_t*) counts_data, counts_limit);
            return 0;

        case 8:
            apply_to_counts_64(h, (const int64_t*) counts_data, counts_limit);
            return 0;

        case 1:
            return apply_to_counts_zz(h, counts_data, counts_limit);

        default:
            return -1;
    }
}